

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O3

void avx::ProjectionProfile
               (uint32_t rowSize,uint8_t *imageStart,uint32_t height,bool horizontal,uint32_t *out,
               uint32_t simdWidth,uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 (*pauVar1) [32];
  byte *pbVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  uint8_t *puVar5;
  undefined7 in_register_00000009;
  uint8_t *puVar6;
  uint32_t uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [32];
  undefined1 auVar18 [32];
  undefined1 auVar14 [64];
  undefined1 auVar17 [64];
  undefined1 auVar19 [64];
  
  if ((int)CONCAT71(in_register_00000009,horizontal) == 0) {
    if (height * rowSize != 0) {
      puVar6 = imageStart + height * rowSize;
      puVar5 = imageStart + totalSimdWidth;
      do {
        auVar14 = ZEXT1664((undefined1  [16])0x0);
        auVar16 = auVar14._0_32_;
        if (simdWidth != 0) {
          lVar8 = 0;
          do {
            pauVar1 = (undefined1 (*) [32])(imageStart + lVar8);
            lVar8 = lVar8 + 0x20;
            auVar12 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar18 = vpunpcklbw_avx2(*pauVar1,auVar12);
            auVar16 = vpunpckhbw_avx2(*pauVar1,auVar12);
            auVar16 = vpaddw_avx2(auVar18,auVar16);
            auVar18 = vpunpcklwd_avx2(auVar16,auVar12);
            auVar16 = vpunpckhwd_avx2(auVar16,auVar12);
            auVar16 = vpaddd_avx2(auVar14._0_32_,auVar16);
            auVar16 = vpaddd_avx2(auVar16,auVar18);
            auVar14 = ZEXT3264(auVar16);
          } while ((ulong)simdWidth << 5 != lVar8);
        }
        if (nonSimdWidth != 0) {
          uVar7 = *out;
          uVar10 = 0;
          do {
            pbVar2 = puVar5 + uVar10;
            uVar10 = uVar10 + 1;
            uVar7 = uVar7 + *pbVar2;
            *out = uVar7;
          } while (nonSimdWidth != uVar10);
        }
        imageStart = imageStart + rowSize;
        puVar5 = puVar5 + rowSize;
        auVar3 = vphaddd_avx(auVar16._16_16_,auVar16._0_16_);
        auVar3 = vphaddd_avx(auVar3,auVar3);
        auVar3 = vphaddd_avx(auVar3,auVar3);
        *out = *out + auVar3._0_4_;
        out = out + 1;
      } while (imageStart != puVar6);
    }
  }
  else {
    puVar6 = imageStart;
    if (totalSimdWidth != 0) {
      puVar6 = imageStart + totalSimdWidth;
      do {
        auVar14 = ZEXT1664((undefined1  [16])0x0);
        auVar13 = auVar14._0_32_;
        auVar15 = ZEXT1664((undefined1  [16])0x0);
        auVar12 = auVar15._0_32_;
        auVar19 = ZEXT1664((undefined1  [16])0x0);
        auVar18 = auVar19._0_32_;
        auVar17 = ZEXT1664((undefined1  [16])0x0);
        auVar16 = auVar17._0_32_;
        if ((ulong)(height * rowSize) != 0) {
          uVar10 = 0;
          do {
            pauVar1 = (undefined1 (*) [32])(imageStart + uVar10);
            uVar10 = uVar10 + rowSize;
            auVar11 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar16 = vpunpcklbw_avx2(*pauVar1,auVar11);
            auVar18 = vpunpckhbw_avx2(*pauVar1,auVar11);
            auVar13 = vpunpcklwd_avx2(auVar16,auVar11);
            auVar12 = vpunpckhwd_avx2(auVar16,auVar11);
            auVar16 = vpaddd_avx2(auVar17._0_32_,auVar13);
            auVar17 = ZEXT3264(auVar16);
            auVar4 = vpunpcklwd_avx2(auVar18,auVar11);
            auVar13 = vpunpckhwd_avx2(auVar18,auVar11);
            auVar18 = vpaddd_avx2(auVar19._0_32_,auVar12);
            auVar19 = ZEXT3264(auVar18);
            auVar12 = vpaddd_avx2(auVar15._0_32_,auVar4);
            auVar15 = ZEXT3264(auVar12);
            auVar13 = vpaddd_avx2(auVar14._0_32_,auVar13);
            auVar14 = ZEXT3264(auVar13);
          } while (height * rowSize != uVar10);
        }
        auVar16 = vpaddd_avx2(auVar16,*(undefined1 (*) [32])out);
        imageStart = imageStart + 0x20;
        *(undefined1 (*) [32])out = auVar16;
        auVar16 = vpaddd_avx2(auVar18,*(undefined1 (*) [32])((long)out + 0x20));
        *(undefined1 (*) [32])((long)out + 0x20) = auVar16;
        auVar16 = vpaddd_avx2(auVar12,*(undefined1 (*) [32])((long)out + 0x40));
        *(undefined1 (*) [32])((long)out + 0x40) = auVar16;
        auVar16 = vpaddd_avx2(auVar13,*(undefined1 (*) [32])((long)out + 0x60));
        *(undefined1 (*) [32])((long)out + 0x60) = auVar16;
        out = (uint32_t *)((long)out + 0x80);
      } while (imageStart != puVar6);
    }
    if (nonSimdWidth != 0) {
      puVar5 = puVar6 + nonSimdWidth;
      do {
        if ((ulong)(height * rowSize) != 0) {
          iVar9 = *(int *)*(undefined1 (*) [32])out;
          uVar10 = 0;
          do {
            pbVar2 = puVar6 + uVar10;
            uVar10 = uVar10 + rowSize;
            iVar9 = iVar9 + (uint)*pbVar2;
            *(int *)*(undefined1 (*) [32])out = iVar9;
          } while (height * rowSize != uVar10);
        }
        puVar6 = puVar6 + 1;
        out = (uint32_t *)(*(undefined1 (*) [32])out + 4);
      } while (puVar6 != puVar5);
    }
  }
  return;
}

Assistant:

void ProjectionProfile( uint32_t rowSize, const uint8_t * imageStart, uint32_t height, bool horizontal,
                            uint32_t * out, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const simd zero = _mm256_setzero_si256();

        if( horizontal ) {
            const uint8_t * imageSimdXEnd = imageStart + totalSimdWidth;

            for( ; imageStart != imageSimdXEnd; imageStart += simdSize, out += simdSize ) {
                const uint8_t * imageSimdY = imageStart;
                const uint8_t * imageSimdYEnd = imageSimdY + height * rowSize;
                simd simdSum_1 = _mm256_setzero_si256();
                simd simdSum_2 = _mm256_setzero_si256();
                simd simdSum_3 = _mm256_setzero_si256();
                simd simdSum_4 = _mm256_setzero_si256();

                simd * dst = reinterpret_cast <simd*> (out);

                for( ; imageSimdY != imageSimdYEnd; imageSimdY += rowSize) {
                    const simd * src    = reinterpret_cast <const simd*> (imageSimdY);

                    const simd data = _mm256_loadu_si256( src );

                    const simd dataLo  = _mm256_unpacklo_epi8( data, zero );
                    const simd dataHi  = _mm256_unpackhi_epi8( data, zero );

                    const simd data_1 = _mm256_unpacklo_epi16( dataLo, zero );
                    const simd data_2 = _mm256_unpackhi_epi16( dataLo, zero );
                    const simd data_3 = _mm256_unpacklo_epi16( dataHi, zero );
                    const simd data_4 = _mm256_unpackhi_epi16( dataHi, zero );
                    simdSum_1 = _mm256_add_epi32( data_1, simdSum_1 );
                    simdSum_2 = _mm256_add_epi32( data_2, simdSum_2 );
                    simdSum_3 = _mm256_add_epi32( data_3, simdSum_3 );
                    simdSum_4 = _mm256_add_epi32( data_4, simdSum_4 );
                }

                _mm256_storeu_si256( dst, _mm256_add_epi32( simdSum_1, _mm256_loadu_si256( dst ) ) );
                ++dst;
                _mm256_storeu_si256( dst, _mm256_add_epi32( simdSum_2, _mm256_loadu_si256( dst ) ) );
                ++dst;
                _mm256_storeu_si256( dst, _mm256_add_epi32( simdSum_3, _mm256_loadu_si256( dst ) ) );
                ++dst;
                _mm256_storeu_si256( dst, _mm256_add_epi32( simdSum_4, _mm256_loadu_si256( dst ) ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t* imageXEnd = imageStart + nonSimdWidth;

                for( ; imageStart != imageXEnd; ++imageStart, ++out ) {
                    const uint8_t * imageY    = imageStart;
                    const uint8_t * imageYEnd = imageY + height * rowSize;

                    for( ; imageY != imageYEnd; imageY += rowSize )
                        (*out) += (*imageY);
                }
            }
        }
        else {
            const uint8_t * imageYEnd = imageStart + height * rowSize;

            for( ; imageStart != imageYEnd; imageStart += rowSize, ++out ) {
                const simd * src    = reinterpret_cast <const simd*> (imageStart);
                const simd * srcEnd = src + simdWidth;
                simd simdSum = _mm256_setzero_si256();

                for( ; src != srcEnd; ++src ) {
                    simd data = _mm256_loadu_si256( src );

                    simd dataLo  = _mm256_unpacklo_epi8( data, zero );
                    simd dataHi  = _mm256_unpackhi_epi8( data, zero );
                    simd sumLoHi = _mm256_add_epi16( dataLo, dataHi );

                    simdSum = _mm256_add_epi32( simdSum, _mm256_add_epi32( _mm256_unpacklo_epi16( sumLoHi, zero ),
                                                                           _mm256_unpackhi_epi16( sumLoHi, zero ) ) );
                }

                if( nonSimdWidth > 0 ) {
                    const uint8_t * imageX    = imageStart + totalSimdWidth;
                    const uint8_t * imageXEnd = imageX + nonSimdWidth;

                    for( ; imageX != imageXEnd; ++imageX )
                        (*out) += (*imageX);
                }

                uint32_t output[8] = { 0 };
                _mm256_storeu_si256( reinterpret_cast <simd*>(output), simdSum );
                
                (*out) += output[0] + output[1] + output[2] + output[3] + output[4] + output[5] + output[6] + output[7];
            }
        }
    }